

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<Assimp::FIShortValue> __thiscall
Assimp::FIShortValue::create(FIShortValue *this,vector<short,_std::allocator<short>_> *value)

{
  pointer psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<Assimp::FIShortValue> sVar2;
  
  psVar1 = (pointer)operator_new(0x58);
  psVar1[4] = 1;
  psVar1[5] = 0;
  psVar1[6] = 1;
  psVar1[7] = 0;
  *(undefined ***)psVar1 = &PTR___Sp_counted_ptr_inplace_008a0168;
  psVar1[0xc] = 0;
  psVar1[0xd] = 0;
  psVar1[0xe] = 0;
  psVar1[0xf] = 0;
  psVar1[0x10] = 0;
  psVar1[0x11] = 0;
  psVar1[0x12] = 0;
  psVar1[0x13] = 0;
  psVar1[0x14] = 0;
  psVar1[0x15] = 0;
  psVar1[0x16] = 0;
  psVar1[0x17] = 0;
  *(undefined ***)(psVar1 + 8) = &PTR_toString_abi_cxx11__008a01b8;
  *(pointer *)(psVar1 + 0x18) = psVar1 + 0x20;
  psVar1[0x1c] = 0;
  psVar1[0x1d] = 0;
  psVar1[0x1e] = 0;
  psVar1[0x1f] = 0;
  *(undefined1 *)(psVar1 + 0x20) = 0;
  *(undefined1 *)(psVar1 + 0x28) = 0;
  std::vector<short,_std::allocator<short>_>::_M_move_assign
            ((vector<short,_std::allocator<short>_> *)(psVar1 + 0xc),value);
  (this->super_FIValue)._vptr_FIValue = (_func_int **)(psVar1 + 8);
  (this->value).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = psVar1;
  sVar2.super___shared_ptr<Assimp::FIShortValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Assimp::FIShortValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIShortValue>)
         sVar2.super___shared_ptr<Assimp::FIShortValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIShortValue> FIShortValue::create(std::vector<int16_t> &&value) {
    return std::make_shared<FIShortValueImpl>(std::move(value));
}